

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_3uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  pbVar7 = pSrc + 1;
  for (uVar12 = 0; uVar12 < (length & 0xfffffffffffffff8); uVar12 = uVar12 + 8) {
    bVar1 = pbVar7[-1];
    bVar2 = *pbVar7;
    bVar3 = pbVar7[1];
    pDst[uVar12] = (uint)(bVar1 >> 5);
    pDst[uVar12 + 1] = bVar1 >> 2 & 7;
    pDst[uVar12 + 2] = (uint)(bVar2 >> 7) + (bVar1 & 3) * 2;
    pDst[uVar12 + 3] = bVar2 >> 4 & 7;
    pDst[uVar12 + 4] = bVar2 >> 1 & 7;
    pDst[uVar12 + 5] = (uint)(bVar3 >> 6) + (bVar2 & 1) * 4;
    pDst[uVar12 + 6] = bVar3 >> 3 & 7;
    pDst[uVar12 + 7] = bVar3 & 7;
    pbVar7 = pbVar7 + 3;
  }
  if ((length & 7) != 0) {
    bVar1 = pbVar7[-1];
    pDst[uVar12] = (uint)(bVar1 >> 5);
    uVar11 = (uint)(length & 7);
    if ((uVar11 != 1) && (pDst[uVar12 + 1] = bVar1 >> 2 & 7, 2 < uVar11)) {
      uVar10 = 0;
      uVar5 = 3;
      uVar6 = 2;
      while( true ) {
        uVar13 = (uint)bVar1;
        iVar4 = uVar6 - uVar5;
        if (uVar5 <= uVar6) break;
        uVar10 = (uVar10 | uVar13 & 3) * 2;
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        uVar6 = 8;
        uVar5 = 1;
      }
      pDst[uVar12 + 2] = ~(-1 << (sbyte)uVar5) & (uint)(bVar1 >> ((byte)iVar4 & 0x1f)) | uVar10;
      if (uVar11 != 3) {
        uVar10 = 0;
        iVar9 = 3;
        while (iVar8 = iVar9 - iVar4, iVar8 != 0 && iVar4 <= iVar9) {
          uVar10 = (uVar10 | uVar13 & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)iVar8 & 0x1f);
          uVar13 = (uint)*pbVar7;
          pbVar7 = pbVar7 + 1;
          iVar9 = iVar8;
          iVar4 = 8;
        }
        iVar4 = iVar4 - iVar9;
        pDst[uVar12 + 3] = ~(-1 << ((byte)iVar9 & 0x1f)) & uVar13 >> ((byte)iVar4 & 0x1f) | uVar10;
        if (4 < uVar11) {
          uVar10 = 0;
          iVar8 = 3;
          iVar9 = 3;
          if (iVar4 != 0) goto LAB_0010df7d;
          while( true ) {
            iVar8 = iVar9;
            uVar13 = (uint)*pbVar7;
            pbVar7 = pbVar7 + 1;
            iVar4 = 8;
LAB_0010df7d:
            iVar9 = iVar8 - iVar4;
            if (iVar9 == 0 || iVar8 < iVar4) break;
            uVar10 = (uVar10 | uVar13 & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)iVar9 & 0x1f);
          }
          iVar4 = iVar4 - iVar8;
          pDst[uVar12 + 4] = ~(-1 << ((byte)iVar8 & 0x1f)) & uVar13 >> ((byte)iVar4 & 0x1f) | uVar10
          ;
          if (uVar11 != 5) {
            uVar10 = 0;
            iVar8 = 3;
            iVar9 = 3;
            if (iVar4 != 0) goto LAB_0010dfe3;
            while( true ) {
              iVar8 = iVar9;
              uVar13 = (uint)*pbVar7;
              pbVar7 = pbVar7 + 1;
              iVar4 = 8;
LAB_0010dfe3:
              iVar9 = iVar8 - iVar4;
              if (iVar9 == 0 || iVar8 < iVar4) break;
              uVar10 = (uVar10 | uVar13 & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)iVar9 & 0x1f);
            }
            iVar4 = iVar4 - iVar8;
            pDst[uVar12 + 5] =
                 ~(-1 << ((byte)iVar8 & 0x1f)) & uVar13 >> ((byte)iVar4 & 0x1f) | uVar10;
            if (uVar11 == 7) {
              uVar11 = 0;
              iVar8 = 3;
              iVar9 = 3;
              if (iVar4 != 0) goto LAB_0010e045;
              while( true ) {
                iVar8 = iVar9;
                uVar13 = (uint)*pbVar7;
                pbVar7 = pbVar7 + 1;
                iVar4 = 8;
LAB_0010e045:
                iVar9 = iVar8 - iVar4;
                if (iVar9 == 0 || iVar8 < iVar4) break;
                uVar11 = (uVar11 | uVar13 & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)iVar9 & 0x1f);
              }
              pDst[uVar12 + 6] =
                   ~(-1 << ((byte)iVar8 & 0x1f)) & uVar13 >> ((byte)iVar4 - (byte)iVar8 & 0x1f) |
                   uVar11;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_3uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 >> 5));
        pDst[i + 1] = (OPJ_INT32)(((val0 & 0x1FU) >> 2));
        pDst[i + 2] = (OPJ_INT32)(((val0 & 0x3U) << 1) | (val1 >> 7));
        pDst[i + 3] = (OPJ_INT32)(((val1 & 0x7FU) >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val1 & 0xFU) >> 1));
        pDst[i + 5] = (OPJ_INT32)(((val1 & 0x1U) << 2) | (val2 >> 6));
        pDst[i + 6] = (OPJ_INT32)(((val2 & 0x3FU) >> 3));
        pDst[i + 7] = (OPJ_INT32)(((val2 & 0x7U)));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 3)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 3)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 3)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 3)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 3)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 3)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 3)
                            }
                        }
                    }
                }
            }
        }
    }
}